

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O2

void __thiscall
slang::ast::ASTVisitor<register_has_no_reset::MainVisitor,_true,_true,_false,_false>::
visitDefault<slang::ast::GenericClassDefSymbol>
          (ASTVisitor<register_has_no_reset::MainVisitor,_true,_true,_false,_false> *this,
          GenericClassDefSymbol *t)

{
  DeclaredType *this_00;
  Expression *this_01;
  _Iterator<false> __begin0;
  iterator local_40;
  undefined1 *local_30;
  undefined1 local_28 [8];
  SpecMap *local_20;
  
  this_00 = Symbol::getDeclaredType(&t->super_Symbol);
  if (this_00 != (DeclaredType *)0x0) {
    this_01 = DeclaredType::getInitializer(this_00);
    if (this_01 != (Expression *)0x0) {
      Expression::visit<register_has_no_reset::MainVisitor&>(this_01,(AlwaysFFVisitor *)this);
    }
  }
  local_20 = &t->specMap;
  local_40 = boost::unordered::detail::foa::
             table<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_slang::ast::detail::ClassSpecializationHasher,_std::equal_to<slang::ast::detail::ClassSpecializationKey>,_std::allocator<std::pair<const_slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>_>_>
             ::begin(&local_20->table_);
  local_30 = local_28;
  while (local_40.p_ != (table_element_pointer)0x0) {
    Symbol::visit<register_has_no_reset::MainVisitor&>
              (&(local_40.p_)->second->super_Symbol,(AlwaysFFVisitor *)this);
    boost::unordered::detail::foa::
    table_iterator<boost::unordered::detail::foa::flat_map_types<slang::ast::detail::ClassSpecializationKey,_const_slang::ast::Type_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
    ::increment(&local_40);
  }
  return;
}

Assistant:

void visitDefault(const T& t) {
        if constexpr (VisitExpressions && HasVisitExprs<T, TDerived>) {
            t.visitExprs(DERIVED);
        }
        else if constexpr (VisitExpressions && std::is_base_of_v<Symbol, T>) {
            if (auto declaredType = t.getDeclaredType()) {
                if (auto init = declaredType->getInitializer())
                    init->visit(DERIVED);
            }
        }

        if constexpr (VisitStatements && requires { t.visitStmts(DERIVED); }) {
            t.visitStmts(DERIVED);
        }

        if constexpr (std::is_base_of_v<GenericClassDefSymbol, T>) {
            for (auto&& spec : t.specializations())
                spec.visit(DERIVED);
        }

        if constexpr (std::is_base_of_v<Scope, T>) {
            for (auto& member : t.members())
                member.visit(DERIVED);
        }

        if constexpr (std::is_same_v<InstanceSymbol, T>) {
            if constexpr (VisitCanonical) {
                const auto& body = t.getCanonicalBody() ? *t.getCanonicalBody() : t.body;
                body.visit(DERIVED);
            }
            else {
                t.body.visit(DERIVED);
            }
        }

        if constexpr (std::is_same_v<CheckerInstanceSymbol, T>) {
            t.body.visit(DERIVED);
        }
    }